

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLANG.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients::verifyLANG
               (int LANG)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if (LANG == 0) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("LANG value: {}",LANG);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLANG( int LANG ) {

  if ( LANG != 0 ) {

    Log::error( "Encountered illegal LANG value" );
    Log::info( "LANG must be equal to 0 for legendre coefficients" );
    Log::info( "LANG value: {}", LANG );
    throw std::exception();
  }
}